

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztetrahedron.cpp
# Opt level: O0

void pztopology::TPZTetrahedron::TShape<Fad<double>>
               (TPZVec<Fad<double>_> *loc,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  TPZFMatrix<Fad<double>_> *this;
  Fad<double> *row;
  Fad<double> *this_00;
  Fad<double> *val;
  Fad<double> *this_01;
  TPZVec<Fad<double>_> *in_RDI;
  Fad<double> zeta;
  Fad<double> eta;
  Fad<double> qsi;
  Fad<double> *in_stack_fffffffffffffe48;
  Fad<double> *in_stack_fffffffffffffe50;
  Fad<double> *in_stack_fffffffffffffe58;
  Fad<double> *in_stack_fffffffffffffe60;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
  *in_stack_fffffffffffffe68;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffe70;
  Fad<double> *in_stack_fffffffffffffe80;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *in_stack_fffffffffffffe88;
  Fad<double> *in_stack_fffffffffffffe90;
  double in_stack_fffffffffffffe98;
  
  TPZVec<Fad<double>_>::operator[](in_RDI,0);
  Fad<double>::Fad(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  TPZVec<Fad<double>_>::operator[](in_RDI,1);
  Fad<double>::Fad(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  TPZVec<Fad<double>_>::operator[](in_RDI,2);
  Fad<double>::Fad(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  operator-<double,_Fad<double>,_nullptr>(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  operator-<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  operator-<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffffe70,(int64_t)in_stack_fffffffffffffe68,
             (int64_t)in_stack_fffffffffffffe60);
  Fad<double>::operator=((Fad<double> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
  ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffffe50);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
            *)in_stack_fffffffffffffe50);
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffffe50);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffffe70,(int64_t)in_stack_fffffffffffffe68,
             (int64_t)in_stack_fffffffffffffe60);
  Fad<double>::operator=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffffe70,(int64_t)in_stack_fffffffffffffe68,
             (int64_t)in_stack_fffffffffffffe60);
  Fad<double>::operator=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffffe70,(int64_t)in_stack_fffffffffffffe68,
             (int64_t)in_stack_fffffffffffffe60);
  Fad<double>::operator=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffffe70,(int64_t)in_stack_fffffffffffffe68,
             (int64_t)in_stack_fffffffffffffe60);
  Fad<double>::operator=<double,_nullptr>
            (in_stack_fffffffffffffe60,&in_stack_fffffffffffffe58->val_);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffffe70,(int64_t)in_stack_fffffffffffffe68,
             (int64_t)in_stack_fffffffffffffe60);
  Fad<double>::operator=<double,_nullptr>
            (in_stack_fffffffffffffe60,&in_stack_fffffffffffffe58->val_);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffffe70,(int64_t)in_stack_fffffffffffffe68,
             (int64_t)in_stack_fffffffffffffe60);
  Fad<double>::operator=<double,_nullptr>
            (in_stack_fffffffffffffe60,&in_stack_fffffffffffffe58->val_);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffffe70,(int64_t)in_stack_fffffffffffffe68,
             (int64_t)in_stack_fffffffffffffe60);
  Fad<double>::operator=<double,_nullptr>
            (in_stack_fffffffffffffe60,&in_stack_fffffffffffffe58->val_);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffffe70,(int64_t)in_stack_fffffffffffffe68,
             (int64_t)in_stack_fffffffffffffe60);
  Fad<double>::operator=<double,_nullptr>
            (in_stack_fffffffffffffe60,&in_stack_fffffffffffffe58->val_);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffffe70,(int64_t)in_stack_fffffffffffffe68,
             (int64_t)in_stack_fffffffffffffe60);
  Fad<double>::operator=<double,_nullptr>
            (in_stack_fffffffffffffe60,&in_stack_fffffffffffffe58->val_);
  this = (TPZFMatrix<Fad<double>_> *)
         TPZFMatrix<Fad<double>_>::operator()
                   (in_stack_fffffffffffffe70,(int64_t)in_stack_fffffffffffffe68,
                    (int64_t)in_stack_fffffffffffffe60);
  Fad<double>::operator=<double,_nullptr>
            (in_stack_fffffffffffffe60,&in_stack_fffffffffffffe58->val_);
  row = TPZFMatrix<Fad<double>_>::operator()
                  (this,(int64_t)in_stack_fffffffffffffe68,(int64_t)in_stack_fffffffffffffe60);
  Fad<double>::operator=<double,_nullptr>
            (in_stack_fffffffffffffe60,&in_stack_fffffffffffffe58->val_);
  this_00 = TPZFMatrix<Fad<double>_>::operator()
                      (this,(int64_t)row,(int64_t)in_stack_fffffffffffffe60);
  Fad<double>::operator=<double,_nullptr>(this_00,&in_stack_fffffffffffffe58->val_);
  val = TPZFMatrix<Fad<double>_>::operator()(this,(int64_t)row,(int64_t)this_00);
  Fad<double>::operator=<double,_nullptr>(this_00,&val->val_);
  this_01 = TPZFMatrix<Fad<double>_>::operator()(this,(int64_t)row,(int64_t)this_00);
  Fad<double>::operator=<double,_nullptr>(this_00,&val->val_);
  TPZFMatrix<Fad<double>_>::operator()(this,(int64_t)row,(int64_t)this_00);
  Fad<double>::operator=<double,_nullptr>(this_00,&val->val_);
  Fad<double>::~Fad(this_01);
  Fad<double>::~Fad(this_01);
  Fad<double>::~Fad(this_01);
  return;
}

Assistant:

inline void TPZTetrahedron::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
        T qsi = loc[0], eta = loc[1] , zeta  = loc[2];

        phi(0,0)  = 1.0-qsi-eta-zeta;
        phi(1,0)  = qsi;
        phi(2,0)  = eta;
        phi(3,0)  = zeta;

        dphi(0,0) = -1.0;
        dphi(1,0) = -1.0;
        dphi(2,0) = -1.0;
        dphi(0,1) =  1.0;
        dphi(1,1) =  0.0;
        dphi(2,1) =  0.0;
        dphi(0,2) =  0.0;
        dphi(1,2) =  1.0;
        dphi(2,2) =  0.0;
        dphi(0,3) =  0.0;
        dphi(1,3) =  0.0;
        dphi(2,3) =  1.0;

    }